

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::StringPtr>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,StringPtr *params_1,
          StringPtr *params_2)

{
  size_t sVar1;
  size_t sVar2;
  size_t __n;
  char *pcVar3;
  long lVar4;
  char *__dest;
  
  lVar4 = params->size_ + *(long *)(this + 8);
  sVar2 = (params_1->content).size_;
  sVar1 = (sVar2 - 1) + lVar4;
  __dest = (char *)HeapArrayDisposer::allocateImpl
                             (1,sVar1,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  __dest[lVar4 + sVar2 + -2] = '\0';
  (__return_storage_ptr__->content).ptr = __dest;
  (__return_storage_ptr__->content).size_ = sVar1;
  (__return_storage_ptr__->content).disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  if (sVar1 == 0) {
    __dest = (char *)0x0;
  }
  __n = *(size_t *)(this + 8);
  if (__n != 0) {
    memcpy(__dest,*(void **)this,__n);
    __dest = __dest + __n;
  }
  pcVar3 = params->ptr;
  sVar1 = params->size_;
  if (pcVar3 != pcVar3 + (sVar1 - 1)) {
    memcpy(__dest,pcVar3,sVar1 - 1);
    __dest = __dest + (sVar1 - 1);
  }
  pcVar3 = (params_1->content).ptr;
  sVar1 = (params_1->content).size_;
  if (pcVar3 != pcVar3 + (sVar1 - 1)) {
    memcpy(__dest,pcVar3,sVar1 - 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}